

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O3

void __thiscall
libtorrent::mmap_disk_io::async_hash
          (mmap_disk_io *this,storage_index_t storage,piece_index_t piece,
          span<libtorrent::digest32<256L>_> v2,disk_job_flags_t flags,
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
          *handler)

{
  mmap_disk_job *j;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_6c;
  __shared_ptr<libtorrent::aux::mmap_storage,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  span<libtorrent::digest32<256L>_> local_58;
  digest32<160L> local_48;
  
  local_58.m_len = v2.m_len;
  local_58.m_ptr = v2.m_ptr;
  local_6c.m_val = piece.m_val;
  ::std::__shared_ptr<libtorrent::aux::mmap_storage,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::mmap_storage,void>
            (local_68,*(__weak_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2> **)
                       &(this->m_torrents).m_torrents.
                        super_vector<std::shared_ptr<libtorrent::aux::mmap_storage>,_std::allocator<std::shared_ptr<libtorrent::aux::mmap_storage>_>_>
                        .
                        super__Vector_base<std::shared_ptr<libtorrent::aux::mmap_storage>,_std::allocator<std::shared_ptr<libtorrent::aux::mmap_storage>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[storage.m_val].
                        super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>
            );
  local_48.m_number._M_elems[0] = 0;
  local_48.m_number._M_elems[1] = 0;
  local_48.m_number._M_elems[2] = 0;
  local_48.m_number._M_elems[3] = 0;
  local_48.m_number._M_elems[4] = 0;
  j = aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
      allocate_job<libtorrent::aux::job::hash,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,libtorrent::span<libtorrent::digest32<256l>>const&,libtorrent::digest32<160l>>
                (&this->m_job_pool,flags,(shared_ptr<libtorrent::aux::mmap_storage> *)local_68,
                 handler,&local_6c,&local_58,&local_48);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  add_job(this,j,true);
  return;
}

Assistant:

void mmap_disk_io::async_hash(storage_index_t const storage
		, piece_index_t const piece, span<sha256_hash> const v2, disk_job_flags_t const flags
		, std::function<void(piece_index_t, sha1_hash const&, storage_error const&)> handler)
	{
		TORRENT_ASSERT(valid_flags(flags));
		aux::mmap_disk_job* j = m_job_pool.allocate_job<aux::job::hash>(
			flags,
			m_torrents[storage]->shared_from_this(),
			std::move(handler),
			piece,
			v2,
			sha1_hash{}
		);
		add_job(j);
	}